

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example.cc
# Opt level: O2

uint32_t IntegerLog2(uint64_t n)

{
  uint uVar1;
  
  if (n == 0) {
    uVar1 = 1;
  }
  else {
    uVar1 = (uint)((n & n - 1) != 0);
  }
  for (; 1 < n; n = n >> 1) {
    uVar1 = uVar1 + 1;
  }
  return uVar1;
}

Assistant:

uint32_t IntegerLog2(uint64_t n) {
  // TODO: Add support for hardware instruction
  uint32_t l = ISPOWOF2(n) ? 0 : 1;
  while (n >>= 1)
    ++l;
  return l;
}